

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O3

int __thiscall InvertDatabase::make_l1_pass(InvertDatabase *this)

{
  int *piVar1;
  int *piVar2;
  Env *this_00;
  pointer piVar3;
  Partition *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  uint supsz;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  element_type *peVar8;
  Env *this_03;
  long lVar9;
  long lVar10;
  long lVar11;
  int ivalsz;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> ival;
  undefined1 local_79;
  int local_78;
  uint local_74;
  vector<int,_std::allocator<int>_> *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_68;
  vint *local_60;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_58;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_48;
  ostream *local_38;
  
  this_00 = this->env;
  local_60 = &this->backidx;
  std::vector<int,_std::allocator<int>_>::resize(local_60,100);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->fidx,
             (long)((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->dbase_max_item);
  this->numfreq = 0;
  local_74 = 100;
  local_70 = (vector<int,_std::allocator<int>_> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>,int&>
            (&_Stack_68,&local_70,(allocator<std::vector<int,_std::allocator<int>_>_> *)&local_79,
             (int *)&local_74);
  if (0 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          dbase_max_item) {
    local_38 = (ostream *)&this_00->idlstrm;
    local_78 = 100;
    lVar11 = 0;
    do {
      iVar5 = (int)lVar11;
      supsz = Partition::partition_get_idxsup
                        ((this->partition).super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,iVar5);
      if ((int)local_74 < (int)supsz) {
        local_74 = supsz;
        std::vector<int,_std::allocator<int>_>::resize(local_70,(long)(int)supsz);
      }
      piVar3 = (local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      this_01 = (this->partition).super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_48.
      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = local_70;
      local_48.
      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Stack_68._M_pi;
      if (_Stack_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_68._M_pi)->_M_use_count = (_Stack_68._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_68._M_pi)->_M_use_count = (_Stack_68._M_pi)->_M_use_count + 1;
        }
      }
      Partition::partition_read_item(this_01,&local_48,iVar5);
      if (local_48.
          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.
                   super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      peVar8 = (this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar9 = 0;
      while( true ) {
        iVar4 = ClassInfo::get_num_class(peVar8);
        if (iVar4 <= lVar9) break;
        peVar8 = (this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (peVar8->tmpe).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar9] = 0;
        lVar9 = lVar9 + 1;
      }
      if (0 < (int)supsz) {
        peVar8 = (this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar4 = -1;
        uVar7 = 0;
        do {
          if (iVar4 != piVar3[uVar7]) {
            if (peVar8->has_class == true) {
              lVar9 = (long)(peVar8->classes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7];
            }
            else {
              lVar9 = 0;
            }
            piVar1 = (peVar8->tmpe).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar9;
            *piVar1 = *piVar1 + 1;
            iVar4 = piVar3[uVar7];
          }
          uVar7 = uVar7 + 2;
        } while (uVar7 < supsz);
      }
      (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = -1;
      peVar8 = (this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar9 = 0;
      do {
        iVar4 = ClassInfo::get_num_class(peVar8);
        if (iVar4 <= lVar9) goto LAB_00119837;
        peVar8 = (this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        piVar1 = (peVar8->tmpe).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar9;
        piVar2 = (peVar8->min_supports).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar9;
        lVar9 = lVar9 + 1;
      } while (*piVar1 < *piVar2);
      iVar4 = this->numfreq;
      if (local_78 <= iVar4) {
        local_78 = local_78 * 2;
        std::vector<int,_std::allocator<int>_>::resize(local_60,(long)local_78);
        iVar4 = this->numfreq;
      }
      (this->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar4] = iVar5;
      iVar4 = this->numfreq;
      (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = iVar4;
      this->numfreq = iVar4 + 1;
      lVar9 = 0;
      lVar10 = 0;
      while( true ) {
        iVar4 = ClassInfo::get_num_class
                          ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
        if (iVar4 <= lVar10) break;
        Array::add((Array *)((long)&(((this->itsup).
                                      super__Vector_base<Array,_std::allocator<Array>_>._M_impl.
                                      super__Vector_impl_data._M_start)->theArray).
                                    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + lVar9),
                   (((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   tmpe).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10]);
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0x18;
      }
      if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          outputfreq != '\0') {
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)this_00,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," --",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
        iVar5 = get_sup(this,iVar5,-1);
        std::ostream::operator<<((ostream *)this_00,iVar5);
        lVar9 = 0;
        while( true ) {
          iVar5 = ClassInfo::get_num_class
                            ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
          if (iVar5 <= lVar9) break;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
          std::ostream::operator<<
                    ((ostream *)this_00,
                     (((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->tmpe).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9]);
          lVar9 = lVar9 + 1;
        }
        this_03 = this_00;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
        if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            print_tidlist != '\0') {
          local_58.
          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = local_70;
          local_58.
          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_68._M_pi;
          if (_Stack_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_68._M_pi)->_M_use_count = (_Stack_68._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_68._M_pi)->_M_use_count = (_Stack_68._M_pi)->_M_use_count + 1;
            }
          }
          print_idlist((InvertDatabase *)this_03,local_38,&local_58,supsz);
          if (local_58.
              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_58.
                       super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + (char)this_00);
        std::ostream::put((char)this_00);
        std::ostream::flush();
      }
LAB_00119837:
      lVar11 = lVar11 + 1;
    } while (lVar11 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->dbase_max_item);
  }
  std::vector<int,_std::allocator<int>_>::resize(local_60,(long)this->numfreq);
  this_02._M_pi = _Stack_68._M_pi;
  local_70 = (vector<int,_std::allocator<int>_> *)0x0;
  _Stack_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_02._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar5 = this->numfreq;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
    iVar5 = this->numfreq;
    if (_Stack_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_68._M_pi);
    }
  }
  return iVar5;
}

Assistant:

int InvertDatabase::make_l1_pass() {
    int i, j;
    int supsz;
    int bsz = 100;

    ostringstream &seqstrm = env.seqstrm;
    ostringstream &idlstrm = env.idlstrm;

    backidx.resize(bsz);
    fidx.resize(args->dbase_max_item);

    numfreq = 0;
    int ivalsz = 100;
    shared_ptr<vint> ival = make_shared<vint>(ivalsz);
//   int tt=0;
    for (i = 0; i < args->dbase_max_item; i++) {
        supsz = partition->partition_get_idxsup(i);
        if (ivalsz < supsz) {
            ivalsz = supsz;
            ival->resize(ivalsz);
        }
        int *ival_data = ival->data();
        partition->partition_read_item(ival, i);
        for (j = 0; j < cls->get_num_class(); j++) {
            cls->set_tmpe_item(j, 0);
        }

        int cid = -1;
        for (j = 0; j < supsz; j += 2) {
            if (cid != ival_data[j]) {
                cls->increase_tmpe(j);
            }
            cid = ival_data[j];
        }

        char lflg = 0;
        fidx[i] = -1;       // default init
        for (j = 0; j < cls->get_num_class(); j++) {
            if (cls->strong_esupport(j)) {
                lflg = 1;
                if (numfreq + 1 > bsz) {
                    bsz = 2 * bsz;
                    backidx.resize(bsz);
                }
                backidx[numfreq] = i;
                fidx[i] = numfreq;
                //   cls->TMPE[j] << endl;
                numfreq++;
                break;
            }
        }

        if (lflg) {
            for (j = 0; j < cls->get_num_class(); j++)
                add_sup(cls->get_tmpe_item(j), j);
            if (args->outputfreq) {
                seqstrm << i << " --";
                seqstrm << " " << get_sup(i);
                for (j = 0; j < cls->get_num_class(); j++)
                    seqstrm << " " << cls->get_tmpe_item(j);
                seqstrm << " ";
                if (args->print_tidlist) print_idlist(idlstrm, ival, supsz);
                seqstrm << endl;
            }
        }
    }

    backidx.resize(numfreq);
    ival = nullptr;

    return numfreq;
}